

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O1

RPCHelpMan * wallet::importprivkey(void)

{
  ulong *puVar1;
  long *plVar2;
  string name;
  string name_00;
  string name_01;
  string m_key_name;
  RPCResult result;
  string description;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_00;
  string description_01;
  string description_02;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  undefined1 auVar3 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  undefined8 uVar9;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  undefined8 in_stack_fffffffffffff4d8;
  undefined8 in_stack_fffffffffffff4e8;
  undefined8 in_stack_fffffffffffff4f0;
  undefined8 in_stack_fffffffffffff4f8;
  code *pcVar10;
  undefined8 in_stack_fffffffffffff500;
  pointer in_stack_fffffffffffff508;
  pointer pRVar11;
  pointer in_stack_fffffffffffff510;
  pointer pRVar12;
  pointer in_stack_fffffffffffff518;
  pointer pRVar13;
  undefined1 in_stack_fffffffffffff520 [16];
  undefined1 in_stack_fffffffffffff530 [15];
  bool in_stack_fffffffffffff53f;
  bool bVar14;
  pointer in_stack_fffffffffffff540;
  undefined1 in_stack_fffffffffffff548 [16];
  _Alloc_hider in_stack_fffffffffffff558;
  _Alloc_hider _Var15;
  size_type in_stack_fffffffffffff560;
  undefined8 in_stack_fffffffffffff568;
  undefined8 in_stack_fffffffffffff570;
  _Alloc_hider in_stack_fffffffffffff578;
  _Alloc_hider _Var16;
  size_type in_stack_fffffffffffff580;
  undefined8 in_stack_fffffffffffff588;
  undefined8 in_stack_fffffffffffff590;
  _Alloc_hider in_stack_fffffffffffff598;
  size_type in_stack_fffffffffffff5a0;
  undefined8 in_stack_fffffffffffff5a8;
  undefined8 in_stack_fffffffffffff5b0;
  _Alloc_hider in_stack_fffffffffffff5b8;
  _Alloc_hider _Var17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a38;
  string local_a28;
  string local_a08;
  string local_9e8;
  string local_9c8;
  string local_9a8;
  string local_988;
  string local_968;
  string local_948;
  string local_928;
  string local_908;
  string local_8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  ulong *local_7c8;
  undefined8 local_7c0;
  ulong local_7b8;
  undefined8 uStack_7b0;
  ulong *local_7a8;
  size_type local_7a0;
  ulong local_798;
  undefined8 uStack_790;
  long *local_788 [2];
  long local_778 [2];
  long *local_768 [2];
  long local_758 [2];
  RPCResult local_748;
  undefined1 local_6c0;
  undefined1 *local_6b8;
  undefined8 local_6b0;
  undefined1 local_6a8;
  undefined7 uStack_6a7;
  undefined1 local_698 [32];
  long *local_678 [2];
  long local_668 [2];
  UniValue local_658;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_600;
  undefined1 local_5a8;
  long *local_5a0 [2];
  long local_590 [2];
  undefined1 local_580;
  undefined1 *local_578;
  undefined8 local_570;
  undefined1 local_568;
  undefined7 uStack_567;
  undefined1 local_558 [32];
  long *local_538 [2];
  long local_528 [2];
  uint *local_518;
  undefined8 local_510;
  uint local_508;
  undefined4 uStack_504;
  undefined4 uStack_500;
  undefined4 uStack_4fc;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_4f8;
  undefined1 local_4a0;
  long *local_498 [2];
  long local_488 [2];
  undefined1 local_478;
  vector<RPCArg,_std::allocator<RPCArg>_> local_470;
  undefined1 auStack_458 [8];
  undefined1 local_450 [32];
  long *local_430 [2];
  long local_420 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_410;
  undefined1 local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b0;
  RPCArg local_390;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"importprivkey","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nAdds a private key (as returned by dumpprivkey) to your wallet. Requires a new wallet backup.\nHint: use importmulti to import more than one private key.\n\nNote: This call can take over an hour to complete if rescan is true, during that time, other rpc calls\nmay report that the imported key exists but related transactions are still missing, leading to temporarily incorrect/bogus balances and unspent outputs until rescan completes.\nThe rescan parameter can be set to false if the key was never used to create transactions. If it is set to false,\nbut the key was used to create transactions, rescanblockchain needs to be called with the appropriate block range.\nNote: Use \"getwalletinfo\" to query the scanning progress.\nNote: This command is only compatible with legacy wallets. Use \"importdescriptors\" with \"combo(X)\" for descriptor wallets.\n"
             ,"");
  local_3b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_3b0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"privkey","");
  local_410._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_3b8 = 0;
  local_430[0] = local_420;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_430,"The private key (see dumpprivkey)","");
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_478 = 0;
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_450._0_8_ = (pointer)0x0;
  local_450._8_2_ = 0;
  local_450._10_6_ = 0;
  local_450._16_2_ = 0;
  local_450._18_8_ = 0;
  name._M_string_length = (size_type)in_RDI;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff4e8;
  name.field_2._8_8_ = in_stack_fffffffffffff4f0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff500;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff4f8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_fffffffffffff508;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_fffffffffffff510;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff518;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_16_ = in_stack_fffffffffffff520;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_15_ = in_stack_fffffffffffff530;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _71_1_ = in_stack_fffffffffffff53f;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff540;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff548;
  description_00._M_string_length = in_stack_fffffffffffff560;
  description_00._M_dataplus._M_p = in_stack_fffffffffffff558._M_p;
  description_00.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  description_00.field_2._8_8_ = in_stack_fffffffffffff570;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff580;
  opts._0_8_ = in_stack_fffffffffffff578._M_p;
  opts.oneline_description._M_string_length = in_stack_fffffffffffff588;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff590;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff598._M_p;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff5a0;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff5a8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff5b0;
  opts._64_8_ = in_stack_fffffffffffff5b8._M_p;
  ::RPCArg::RPCArg(&local_390,name,(Type)&local_3b0,fallback,description_00,opts);
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"label","");
  local_518 = &local_508;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_518,"current label if address exists, otherwise \"\"","");
  local_4f8._0_8_ = (long)&local_4f8 + 0x10;
  if (local_518 == &local_508) {
    local_4f8._24_4_ = uStack_500;
    local_4f8._28_4_ = uStack_4fc;
  }
  else {
    local_4f8._0_8_ = local_518;
  }
  local_4f8._8_8_ = local_510;
  local_510 = 0;
  local_508 = local_508 & 0xffffff00;
  local_4a0 = 1;
  local_538[0] = local_528;
  local_518 = &local_508;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_538,"An optional label","");
  local_578 = &local_568;
  local_580 = 0;
  local_570 = 0;
  local_568 = 0;
  local_558._0_8_ = (pointer)0x0;
  local_558._8_2_ = 0;
  local_558._10_6_ = 0;
  local_558._16_2_ = 0;
  local_558._18_8_ = 0;
  name_00._M_string_length = (size_type)in_RDI;
  name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff4e8;
  name_00.field_2._8_8_ = in_stack_fffffffffffff4f0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff500;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff4f8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_fffffffffffff508;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_fffffffffffff510;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff518;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_16_ = in_stack_fffffffffffff520;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_15_ = in_stack_fffffffffffff530;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _71_1_ = in_stack_fffffffffffff53f;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff540;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff548;
  description_01._M_string_length = in_stack_fffffffffffff560;
  description_01._M_dataplus._M_p = in_stack_fffffffffffff558._M_p;
  description_01.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  description_01.field_2._8_8_ = in_stack_fffffffffffff570;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff580;
  opts_00._0_8_ = in_stack_fffffffffffff578._M_p;
  opts_00.oneline_description._M_string_length = in_stack_fffffffffffff588;
  opts_00.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff590;
  opts_00.oneline_description.field_2._8_8_ = in_stack_fffffffffffff598._M_p;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff5a0;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff5a8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff5b0;
  opts_00._64_8_ = in_stack_fffffffffffff5b8._M_p;
  ::RPCArg::RPCArg(&local_288,name_00,(Type)local_498,fallback_00,description_01,opts_00);
  local_5a0[0] = local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"rescan","");
  bVar14 = true;
  ::UniValue::UniValue<bool,_bool,_true>(&local_658,(bool *)&stack0xfffffffffffff53f);
  paVar7 = &local_658.val.field_2;
  local_600._8_8_ = (long)&local_600 + 0x18;
  local_600._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_658.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.val._M_dataplus._M_p == paVar7) {
    local_600._32_8_ = local_658.val.field_2._8_8_;
  }
  else {
    local_600._8_8_ = local_658.val._M_dataplus._M_p;
  }
  local_600._16_8_ = local_658.val._M_string_length;
  local_658.val._M_string_length = 0;
  local_658.val.field_2._M_local_buf[0] = '\0';
  local_600._40_8_ =
       local_658.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_600._48_8_ =
       local_658.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_600._56_8_ =
       local_658.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_658.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_658.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_658.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_600._64_4_ =
       local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_600._68_4_ =
       local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_600._72_4_ =
       local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_600._76_4_ =
       local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_600._80_8_ =
       local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_658.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5a8 = 2;
  local_678[0] = local_668;
  local_658.val._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_678,"Scan the chain and mempool for wallet transactions.","");
  local_6b8 = &local_6a8;
  local_6c0 = 0;
  local_6b0 = 0;
  local_6a8 = 0;
  local_698._0_8_ = (pointer)0x0;
  local_698._8_2_ = 0;
  local_698._10_6_ = 0;
  local_698._16_2_ = 0;
  local_698._18_8_ = 0;
  name_01._M_string_length = (size_type)in_RDI;
  name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff4e8;
  name_01.field_2._8_8_ = in_stack_fffffffffffff4f0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff500;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff4f8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_fffffffffffff508;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_fffffffffffff510;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff518;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_16_ = in_stack_fffffffffffff520;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_15_ = in_stack_fffffffffffff530;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _71_1_ = bVar14;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff540;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff548;
  description_02._M_string_length = in_stack_fffffffffffff560;
  description_02._M_dataplus._M_p = in_stack_fffffffffffff558._M_p;
  description_02.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  description_02.field_2._8_8_ = in_stack_fffffffffffff570;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff580;
  opts_01._0_8_ = in_stack_fffffffffffff578._M_p;
  opts_01.oneline_description._M_string_length = in_stack_fffffffffffff588;
  opts_01.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff590;
  opts_01.oneline_description.field_2._8_8_ = in_stack_fffffffffffff598._M_p;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff5a0;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff5a8;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff5b0;
  opts_01._64_8_ = in_stack_fffffffffffff5b8._M_p;
  ::RPCArg::RPCArg(&local_180,name_01,(Type)local_5a0,fallback_01,description_02,opts_01);
  __l._M_len = 3;
  __l._M_array = &local_390;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff540,__l,
             (allocator_type *)&stack0xfffffffffffff53e);
  local_768[0] = local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_768,"");
  local_788[0] = local_778;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"");
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff4e8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff4f0;
  auVar3._16_8_ = 0;
  auVar3._0_16_ = in_stack_fffffffffffff520;
  ::RPCResult::RPCResult
            (&local_748,NONE,m_key_name,
             (string)ZEXT1632(CONCAT88(in_stack_fffffffffffff500,in_stack_fffffffffffff4f8)),
             (vector<RPCResult,_std::allocator<RPCResult>_>)(auVar3 << 0x40),SUB81(local_768,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result._0_8_ = in_stack_fffffffffffff4d8;
  result.m_key_name._M_string_length = in_stack_fffffffffffff4e8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff4f0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff4f8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff500;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar11;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar12;
  result._64_8_ = pRVar13;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff520._0_8_;
  result.m_description._M_string_length = in_stack_fffffffffffff520._8_8_;
  result.m_description.field_2._0_15_ = in_stack_fffffffffffff530;
  result.m_description.field_2._M_local_buf[0xf] = bVar14;
  result.m_cond._M_dataplus._M_p = (pointer)in_stack_fffffffffffff540;
  result.m_cond._8_16_ = in_stack_fffffffffffff548;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffff558._M_p;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffff520,result);
  local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"dumpprivkey","");
  local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_928,"\"myaddress\"","");
  HelpExampleCli(&local_8e8,&local_908,&local_928);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_8e8,0,0,"\nDump a private key\n",0x14);
  local_8c8._M_dataplus._M_p = (pointer)&local_8c8.field_2;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if (paVar7 == paVar6) {
    local_8c8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_8c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_8c8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_8c8._M_dataplus._M_p = (pointer)paVar7;
  }
  local_8c8._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_8c8,"\nImport the private key with rescan\n");
  local_8a8._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8._M_dataplus._M_p == paVar7) {
    local_8a8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_8a8.field_2._8_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 8);
    local_8a8.field_2._12_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 0xc);
    local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
  }
  else {
    local_8a8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_8a8._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_968,"importprivkey","");
  local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_988,"\"mykey\"","");
  HelpExampleCli(&local_948,&local_968,&local_988);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
    uVar9 = local_8a8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_948._M_string_length + local_8a8._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_948._M_dataplus._M_p != &local_948.field_2) {
      uVar9 = local_948.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_948._M_string_length + local_8a8._M_string_length) goto LAB_00ba5dc0;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_948,0,0,local_8a8._M_dataplus._M_p,local_8a8._M_string_length);
  }
  else {
LAB_00ba5dc0:
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_8a8,local_948._M_dataplus._M_p,local_948._M_string_length);
  }
  local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if (paVar6 == paVar7) {
    local_888.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_888.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_888.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_888._M_dataplus._M_p = (pointer)paVar6;
  }
  local_888._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_888,"\nImport using a label and without rescan\n");
  local_868._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p == paVar7) {
    local_868.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_868.field_2._8_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 8);
    local_868.field_2._12_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 0xc);
    local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  }
  else {
    local_868.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_868._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  local_9c8._M_dataplus._M_p = (pointer)&local_9c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9c8,"importprivkey","");
  local_9e8._M_dataplus._M_p = (pointer)&local_9e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9e8,"\"mykey\" \"testing\" false","");
  HelpExampleCli(&local_9a8,&local_9c8,&local_9e8);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    uVar9 = local_868.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_9a8._M_string_length + local_868._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
      uVar9 = local_9a8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_9a8._M_string_length + local_868._M_string_length) goto LAB_00ba5f5f;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_9a8,0,0,local_868._M_dataplus._M_p,local_868._M_string_length);
  }
  else {
LAB_00ba5f5f:
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_868,local_9a8._M_dataplus._M_p,local_9a8._M_string_length);
  }
  local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if (paVar6 == paVar7) {
    local_848.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_848.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_848.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_848._M_dataplus._M_p = (pointer)paVar6;
  }
  local_848._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_848,"\nImport using default blank label and without rescan\n");
  local_828._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p == paVar7) {
    local_828.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_828.field_2._8_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 8);
    local_828.field_2._12_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 0xc);
    local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
  }
  else {
    local_828.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_828._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  local_a28._M_dataplus._M_p = (pointer)&local_a28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a28,"importprivkey","");
  _Var17._M_p = (pointer)&local_a38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff5b8,"\"mykey\" \"\" false","");
  HelpExampleCli(&local_a08,&local_a28,(string *)&stack0xfffffffffffff5b8);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    uVar9 = local_828.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_a08._M_string_length + local_828._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a08._M_dataplus._M_p != &local_a08.field_2) {
      uVar9 = local_a08.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_a08._M_string_length + local_828._M_string_length) goto LAB_00ba60fe;
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_a08,0,0,local_828._M_dataplus._M_p,local_828._M_string_length);
  }
  else {
LAB_00ba60fe:
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_828,local_a08._M_dataplus._M_p,local_a08._M_string_length);
  }
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if (paVar6 == paVar7) {
    local_808.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_808.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_808.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_808._M_dataplus._M_p = (pointer)paVar6;
  }
  local_808._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_808,"\nAs a JSON-RPC call\n");
  paVar7 = &local_7e8.field_2;
  local_7e8._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8._M_dataplus._M_p == paVar6) {
    local_7e8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_7e8.field_2._8_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 8);
    local_7e8.field_2._12_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 0xc);
    local_7e8._M_dataplus._M_p = (pointer)paVar7;
  }
  else {
    local_7e8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_7e8._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  _Var16._M_p = &stack0xfffffffffffff588;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff578,"importprivkey","");
  _Var15._M_p = &stack0xfffffffffffff568;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff558,"\"mykey\", \"testing\", false","");
  HelpExampleRpc((string *)&stack0xfffffffffffff598,(string *)&stack0xfffffffffffff578,
                 (string *)&stack0xfffffffffffff558);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8._M_dataplus._M_p != paVar7) {
    uVar9 = local_7e8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < in_stack_fffffffffffff5a0 + local_7e8._M_string_length) {
    uVar9 = 0xf;
    if (in_stack_fffffffffffff598._M_p != &stack0xfffffffffffff5a8) {
      uVar9 = in_stack_fffffffffffff5a8;
    }
    if (in_stack_fffffffffffff5a0 + local_7e8._M_string_length <= (ulong)uVar9) {
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffff598,0,0,local_7e8._M_dataplus._M_p,
                       local_7e8._M_string_length);
      goto LAB_00ba62c7;
    }
  }
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_7e8,in_stack_fffffffffffff598._M_p,in_stack_fffffffffffff5a0);
LAB_00ba62c7:
  local_7c8 = &local_7b8;
  puVar1 = (ulong *)(pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1 == paVar6) {
    local_7b8 = paVar6->_M_allocated_capacity;
    uStack_7b0 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_7b8 = paVar6->_M_allocated_capacity;
    local_7c8 = puVar1;
  }
  local_7a0 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  paVar6->_M_local_buf[0] = '\0';
  if (local_7c8 == &local_7b8) {
    uStack_790 = uStack_7b0;
    local_7a8 = &local_798;
  }
  else {
    local_7a8 = local_7c8;
  }
  local_798 = local_7b8;
  local_7c0 = 0;
  local_7b8 = local_7b8 & 0xffffffffffffff00;
  pcVar10 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/backup.cpp:145:9)>
            ::_M_manager;
  description._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/backup.cpp:145:9)>
       ::_M_invoke;
  description._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/backup.cpp:145:9)>
                ::_M_manager;
  description.field_2._M_allocated_capacity = (size_type)pRVar11;
  description.field_2._8_8_ = pRVar12;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_fffffffffffff520._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffff520._8_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = pRVar13;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish._7_1_ = bVar14;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._0_15_ = in_stack_fffffffffffff530;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff540;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)_Var15._M_p;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff548._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffff548._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffff560;
  local_7c8 = &local_7b8;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff4e8)),description,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar10 != (code *)0x0) {
    (*pcVar10)(&stack0xfffffffffffff4e8,&stack0xfffffffffffff4e8,3);
  }
  if (local_7a8 != &local_798) {
    operator_delete(local_7a8,local_798 + 1);
  }
  if (local_7c8 != &local_7b8) {
    operator_delete(local_7c8,local_7b8 + 1);
  }
  if (in_stack_fffffffffffff598._M_p != &stack0xfffffffffffff5a8) {
    operator_delete(in_stack_fffffffffffff598._M_p,in_stack_fffffffffffff5a8 + 1);
  }
  if (_Var15._M_p != &stack0xfffffffffffff568) {
    operator_delete(_Var15._M_p,in_stack_fffffffffffff568 + 1);
  }
  if (_Var16._M_p != &stack0xfffffffffffff588) {
    operator_delete(_Var16._M_p,in_stack_fffffffffffff588 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8._M_dataplus._M_p != paVar7) {
    operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a08._M_dataplus._M_p != &local_a08.field_2) {
    operator_delete(local_a08._M_dataplus._M_p,local_a08.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var17._M_p != &local_a38) {
    operator_delete(_Var17._M_p,local_a38._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a28._M_dataplus._M_p != &local_a28.field_2) {
    operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
    operator_delete(local_9a8._M_dataplus._M_p,local_9a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e8._M_dataplus._M_p != &local_9e8.field_2) {
    operator_delete(local_9e8._M_dataplus._M_p,local_9e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c8._M_dataplus._M_p != &local_9c8.field_2) {
    operator_delete(local_9c8._M_dataplus._M_p,local_9c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888._M_dataplus._M_p != &local_888.field_2) {
    operator_delete(local_888._M_dataplus._M_p,local_888.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948._M_dataplus._M_p != &local_948.field_2) {
    operator_delete(local_948._M_dataplus._M_p,local_948.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988._M_dataplus._M_p != &local_988.field_2) {
    operator_delete(local_988._M_dataplus._M_p,local_988.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968._M_dataplus._M_p != &local_968.field_2) {
    operator_delete(local_968._M_dataplus._M_p,local_968.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
    operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
    operator_delete(local_8c8._M_dataplus._M_p,local_8c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
    operator_delete(local_8e8._M_dataplus._M_p,local_8e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != &local_928.field_2) {
    operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908._M_dataplus._M_p != &local_908.field_2) {
    operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff520);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748.m_cond._M_dataplus._M_p != &local_748.m_cond.field_2) {
    operator_delete(local_748.m_cond._M_dataplus._M_p,
                    local_748.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748.m_description._M_dataplus._M_p != &local_748.m_description.field_2) {
    operator_delete(local_748.m_description._M_dataplus._M_p,
                    local_748.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_748.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748.m_key_name._M_dataplus._M_p != &local_748.m_key_name.field_2) {
    operator_delete(local_748.m_key_name._M_dataplus._M_p,
                    local_748.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff508);
  if (local_788[0] != local_778) {
    operator_delete(local_788[0],local_778[0] + 1);
  }
  if (local_768[0] != local_758) {
    operator_delete(local_768[0],local_758[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff540);
  lVar8 = 0x318;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_3b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar8));
    plVar2 = *(long **)((long)&local_410 + lVar8 + 0x40);
    plVar5 = (long *)((long)&local_410 + lVar8 + 0x50);
    if (plVar5 != plVar2) {
      operator_delete(plVar2,*plVar5 + 1);
    }
    plVar5 = (long *)((long)&local_410 + lVar8 + 0x28);
    plVar2 = *(long **)((long)&local_410 + lVar8 + 0x18);
    if (plVar5 != plVar2) {
      operator_delete(plVar2,*plVar5 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_458 + lVar8));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + lVar8
               ));
    if ((long *)((long)local_488 + lVar8) != *(long **)((long)local_498 + lVar8)) {
      operator_delete(*(long **)((long)local_498 + lVar8),*(long *)((long)local_488 + lVar8) + 1);
    }
    lVar8 = lVar8 + -0x108;
  } while (lVar8 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_698);
  if (local_6b8 != &local_6a8) {
    operator_delete(local_6b8,CONCAT71(uStack_6a7,local_6a8) + 1);
  }
  if (local_678[0] != local_668) {
    operator_delete(local_678[0],local_668[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_600._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_658.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_658.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.val._M_dataplus._M_p != &local_658.val.field_2) {
    operator_delete(local_658.val._M_dataplus._M_p,
                    CONCAT71(local_658.val.field_2._M_allocated_capacity._1_7_,
                             local_658.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_5a0[0] != local_590) {
    operator_delete(local_5a0[0],local_590[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_558);
  if (local_578 != &local_568) {
    operator_delete(local_578,CONCAT71(uStack_567,local_568) + 1);
  }
  if (local_538[0] != local_528) {
    operator_delete(local_538[0],local_528[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_4f8._M_first);
  if (local_518 != &local_508) {
    operator_delete(local_518,CONCAT44(uStack_504,local_508) + 1);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_450);
  if (local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_430[0] != local_420) {
    operator_delete(local_430[0],local_420[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_410._M_first);
  if (local_3b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_3b0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_3b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_3b0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan importprivkey()
{
    return RPCHelpMan{"importprivkey",
                "\nAdds a private key (as returned by dumpprivkey) to your wallet. Requires a new wallet backup.\n"
                "Hint: use importmulti to import more than one private key.\n"
            "\nNote: This call can take over an hour to complete if rescan is true, during that time, other rpc calls\n"
            "may report that the imported key exists but related transactions are still missing, leading to temporarily incorrect/bogus balances and unspent outputs until rescan completes.\n"
            "The rescan parameter can be set to false if the key was never used to create transactions. If it is set to false,\n"
            "but the key was used to create transactions, rescanblockchain needs to be called with the appropriate block range.\n"
            "Note: Use \"getwalletinfo\" to query the scanning progress.\n"
            "Note: This command is only compatible with legacy wallets. Use \"importdescriptors\" with \"combo(X)\" for descriptor wallets.\n",
                {
                    {"privkey", RPCArg::Type::STR, RPCArg::Optional::NO, "The private key (see dumpprivkey)"},
                    {"label", RPCArg::Type::STR, RPCArg::DefaultHint{"current label if address exists, otherwise \"\""}, "An optional label"},
                    {"rescan", RPCArg::Type::BOOL, RPCArg::Default{true}, "Scan the chain and mempool for wallet transactions."},
                },
                RPCResult{RPCResult::Type::NONE, "", ""},
                RPCExamples{
            "\nDump a private key\n"
            + HelpExampleCli("dumpprivkey", "\"myaddress\"") +
            "\nImport the private key with rescan\n"
            + HelpExampleCli("importprivkey", "\"mykey\"") +
            "\nImport using a label and without rescan\n"
            + HelpExampleCli("importprivkey", "\"mykey\" \"testing\" false") +
            "\nImport using default blank label and without rescan\n"
            + HelpExampleCli("importprivkey", "\"mykey\" \"\" false") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("importprivkey", "\"mykey\", \"testing\", false")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    if (pwallet->IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Cannot import private keys to a wallet with private keys disabled");
    }

    EnsureLegacyScriptPubKeyMan(*pwallet, true);

    WalletRescanReserver reserver(*pwallet);
    bool fRescan = true;
    {
        LOCK(pwallet->cs_wallet);

        EnsureWalletIsUnlocked(*pwallet);

        std::string strSecret = request.params[0].get_str();
        const std::string strLabel{LabelFromValue(request.params[1])};

        // Whether to perform rescan after import
        if (!request.params[2].isNull())
            fRescan = request.params[2].get_bool();

        if (fRescan && pwallet->chain().havePruned()) {
            // Exit early and print an error.
            // If a block is pruned after this check, we will import the key(s),
            // but fail the rescan with a generic error.
            throw JSONRPCError(RPC_WALLET_ERROR, "Rescan is disabled when blocks are pruned");
        }

        if (fRescan && !reserver.reserve()) {
            throw JSONRPCError(RPC_WALLET_ERROR, "Wallet is currently rescanning. Abort existing rescan or wait.");
        }

        CKey key = DecodeSecret(strSecret);
        if (!key.IsValid()) throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid private key encoding");

        CPubKey pubkey = key.GetPubKey();
        CHECK_NONFATAL(key.VerifyPubKey(pubkey));
        CKeyID vchAddress = pubkey.GetID();
        {
            pwallet->MarkDirty();

            // We don't know which corresponding address will be used;
            // label all new addresses, and label existing addresses if a
            // label was passed.
            for (const auto& dest : GetAllDestinationsForKey(pubkey)) {
                if (!request.params[1].isNull() || !pwallet->FindAddressBookEntry(dest)) {
                    pwallet->SetAddressBook(dest, strLabel, AddressPurpose::RECEIVE);
                }
            }

            // Use timestamp of 1 to scan the whole chain
            if (!pwallet->ImportPrivKeys({{vchAddress, key}}, 1)) {
                throw JSONRPCError(RPC_WALLET_ERROR, "Error adding key to wallet");
            }

            // Add the wpkh script for this key if possible
            if (pubkey.IsCompressed()) {
                pwallet->ImportScripts({GetScriptForDestination(WitnessV0KeyHash(vchAddress))}, /*timestamp=*/0);
            }
        }
    }
    if (fRescan) {
        RescanWallet(*pwallet, reserver);
    }

    return UniValue::VNULL;
},
    };
}